

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

void __thiscall read_node_v10::operator()(read_node_v10 *this,ai_node *node,xr_reader *r)

{
  uint16_t uVar1;
  uint32_t uVar2;
  xr_reader *r_local;
  ai_node *node_local;
  read_node_v10 *this_local;
  
  xray_re::xr_reader::r_cseq<unsigned_char>(r,0xc,node->data);
  uVar1 = xray_re::xr_reader::r_u16(r);
  node->cover = uVar1;
  uVar1 = xray_re::xr_reader::r_u16(r);
  node->low_cover = uVar1;
  uVar1 = xray_re::xr_reader::r_u16(r);
  node->plane = uVar1;
  uVar2 = xray_re::xr_reader::r_u24(r);
  node->packed_xz = uVar2;
  uVar1 = xray_re::xr_reader::r_u16(r);
  node->packed_y = uVar1;
  return;
}

Assistant:

void operator()(ai_node& node, xr_reader& r) const {
	r.r_cseq(12, node.data);
	node.cover = r.r_u16();
	node.low_cover = r.r_u16();
	node.plane = r.r_u16();
	node.packed_xz = r.r_u24();
	node.packed_y = r.r_u16();
}